

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O3

void __thiscall pbrt::StatsAccumulator::WritePixelImages(StatsAccumulator *this)

{
  ulong uVar1;
  pointer pIVar2;
  undefined1 auVar3 [16];
  StatsAccumulator *pSVar4;
  bool bVar5;
  optional<float> *poVar6;
  long *plVar7;
  Stats *pSVar8;
  undefined8 uVar9;
  Tuple2<pbrt::Point2,_int> TVar10;
  optional<float> oVar11;
  long *plVar12;
  ulong uVar13;
  optional<float> oVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  Image *pIVar18;
  long lVar19;
  Float FVar20;
  undefined1 auVar21 [64];
  string n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_1f8;
  long local_1e8;
  long lStack_1e0;
  ulong local_1d8;
  long *local_1d0 [2];
  long local_1c0 [2];
  StatsAccumulator *local_1b0;
  long local_1a8;
  ulong local_1a0;
  string local_198;
  string local_178;
  string local_158;
  ImageMetadata local_138;
  
  pSVar8 = this->stats;
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_158,pixelStatsBaseName_abi_cxx11_,
             DAT_02f310a8 + pixelStatsBaseName_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_158);
  local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header;
  local_138.colorSpace.optionalValue =
       (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
       )0x0;
  local_138.colorSpace.set = false;
  local_138.colorSpace._9_7_ = 0;
  local_138.stringVectors._M_t._M_impl._0_8_ = 0;
  local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_138.NDCFromWorld.optionalValue._52_8_ = 0;
  local_138.NDCFromWorld._60_8_ = 0;
  local_138.pixelBounds.optionalValue._0_8_ = 0;
  local_138.pixelBounds.optionalValue._8_8_ = 0;
  local_138._160_8_ = 0;
  local_138.fullResolution._4_8_ = 0;
  local_138.samplesPerPixel.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
  local_138.samplesPerPixel.set = false;
  local_138.samplesPerPixel._5_3_ = 0;
  local_138.MSE.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  local_138.MSE.set = false;
  local_138.MSE._5_3_ = 0;
  local_138.cameraFromWorld.optionalValue._56_8_ = 0;
  local_138._72_8_ = 0;
  local_138.NDCFromWorld.optionalValue._4_8_ = 0;
  local_138.NDCFromWorld.optionalValue._12_8_ = 0;
  local_138.NDCFromWorld.optionalValue._20_8_ = 0;
  local_138.NDCFromWorld.optionalValue._28_8_ = 0;
  local_138.NDCFromWorld.optionalValue._36_8_ = 0;
  local_138.NDCFromWorld.optionalValue._44_8_ = 0;
  local_138.renderTimeSeconds.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  local_138.renderTimeSeconds.set = false;
  local_138.renderTimeSeconds._5_3_ = 0;
  local_138.cameraFromWorld.optionalValue.__align =
       (anon_struct_4_0_00000001_for___align)(aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  local_138.cameraFromWorld.optionalValue.__data[4] = false;
  local_138.cameraFromWorld.optionalValue._5_3_ = 0;
  local_138.cameraFromWorld.optionalValue._8_8_ = 0;
  local_138.cameraFromWorld.optionalValue._16_4_ =
       (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  local_138.cameraFromWorld.optionalValue.__data[0x14] = false;
  local_138.cameraFromWorld.optionalValue._21_3_ = 0;
  local_138.cameraFromWorld.optionalValue._24_8_ = 0;
  local_138.cameraFromWorld.optionalValue._32_8_ = 0;
  local_138.cameraFromWorld.optionalValue._40_8_ = 0;
  local_138.cameraFromWorld.optionalValue._48_8_ = 0;
  local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar5 = Image::Write(&pSVar8->pixelTime,&local_158,&local_138);
  if (!bVar5) {
    LogFatal<char_const(&)[57]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/stats.cpp"
               ,0x1c1,"Check failed: %s",
               (char (*) [57])"stats->pixelTime.Write(pixelStatsBaseName + \"-time.exr\")");
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&local_138.stringVectors._M_t);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  pSVar8 = this->stats;
  local_1b0 = this;
  if ((pSVar8->pixelCounterImages).super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (pSVar8->pixelCounterImages).super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar16 = 0;
    do {
      pSVar4 = local_1b0;
      oVar14 = (optional<float>)((long)&local_138.cameraFromWorld.optionalValue + 8);
      local_1d0[0] = local_1c0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1d0,pixelStatsBaseName_abi_cxx11_,
                 DAT_02f310a8 + pixelStatsBaseName_abi_cxx11_);
      std::__cxx11::string::append((char *)local_1d0);
      poVar6 = (optional<float> *)
               std::__cxx11::string::_M_append
                         ((char *)local_1d0,
                          (ulong)(pSVar4->stats->pixelCounterNames).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar16]._M_dataplus._M_p)
      ;
      oVar11 = (optional<float>)(poVar6 + 2);
      if (*poVar6 == oVar11) {
        local_138.cameraFromWorld.optionalValue._8_8_ = *(undefined8 *)oVar11;
        local_138.cameraFromWorld.optionalValue._16_8_ = poVar6[3];
        local_138.renderTimeSeconds = oVar14;
      }
      else {
        local_138.cameraFromWorld.optionalValue._8_8_ = *(undefined8 *)oVar11;
        local_138.renderTimeSeconds = *poVar6;
      }
      local_138.cameraFromWorld.optionalValue._0_8_ = poVar6[1];
      *poVar6 = oVar11;
      poVar6[1].optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      poVar6[1].set = false;
      *(undefined3 *)&poVar6[1].field_0x5 = 0;
      poVar6[2].optionalValue.__data[0] = '\0';
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_138);
      local_1f8 = &local_1e8;
      plVar12 = plVar7 + 2;
      if ((long *)*plVar7 == plVar12) {
        local_1e8 = *plVar12;
        lStack_1e0 = plVar7[3];
      }
      else {
        local_1e8 = *plVar12;
        local_1f8 = (long *)*plVar7;
      }
      uVar1 = plVar7[1];
      *plVar7 = (long)plVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if (local_138.renderTimeSeconds != oVar14) {
        operator_delete((void *)local_138.renderTimeSeconds,
                        local_138.cameraFromWorld.optionalValue._8_8_ + 1);
      }
      if (local_1d0[0] != local_1c0) {
        operator_delete(local_1d0[0],local_1c0[0] + 1);
      }
      if (uVar1 != 0) {
        uVar13 = 0;
        do {
          if (*(char *)((long)local_1f8 + uVar13) == '/') {
            *(undefined1 *)((long)local_1f8 + uVar13) = 0x5f;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < uVar1);
      }
      pIVar2 = (pSVar4->stats->pixelCounterImages).
               super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
               super__Vector_impl_data._M_start;
      TVar10 = pIVar2[uVar16].resolution.super_Tuple2<pbrt::Point2,_int>;
      local_1d8 = uVar16;
      if (0 < TVar10.y) {
        pIVar18 = pIVar2 + uVar16;
        lVar15 = 0;
        lVar19 = 0;
        do {
          if (0 < TVar10.x) {
            lVar17 = 0;
            do {
              FVar20 = Image::GetChannel(pIVar18,(Point2i)(lVar15 + lVar17),0,
                                         (WrapMode2D)0x200000002);
              if ((FVar20 != 0.0) || (NAN(FVar20))) {
                pIVar2 = (local_1b0->stats->pixelCounterImages).
                         super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                         super__Vector_impl_data._M_start;
                local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_178,local_1f8,uVar1 + (long)local_1f8);
                local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                     &local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header;
                local_138.colorSpace.optionalValue =
                     (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                      )0x0;
                local_138.colorSpace.set = false;
                local_138.colorSpace._9_7_ = 0;
                local_138.stringVectors._M_t._M_impl._0_8_ = 0;
                local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                     _S_red;
                local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                     (_Base_ptr)0x0;
                local_138.NDCFromWorld.optionalValue._52_8_ = 0;
                local_138.NDCFromWorld._60_8_ = 0;
                local_138.pixelBounds.optionalValue._0_8_ = 0;
                local_138.pixelBounds.optionalValue._8_8_ = 0;
                local_138._160_8_ = 0;
                local_138.fullResolution._4_8_ = 0;
                local_138.samplesPerPixel.optionalValue =
                     (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
                local_138.samplesPerPixel.set = false;
                local_138.samplesPerPixel._5_3_ = 0;
                local_138.MSE.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
                local_138.MSE.set = false;
                local_138.MSE._5_3_ = 0;
                local_138.cameraFromWorld.optionalValue._56_8_ = 0;
                local_138._72_8_ = 0;
                local_138.NDCFromWorld.optionalValue._4_8_ = 0;
                local_138.NDCFromWorld.optionalValue._12_8_ = 0;
                local_138.NDCFromWorld.optionalValue._20_8_ = 0;
                local_138.NDCFromWorld.optionalValue._28_8_ = 0;
                local_138.NDCFromWorld.optionalValue._36_8_ = 0;
                local_138.NDCFromWorld.optionalValue._44_8_ = 0;
                local_138.renderTimeSeconds.optionalValue =
                     (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
                local_138.renderTimeSeconds.set = false;
                local_138.renderTimeSeconds._5_3_ = 0;
                local_138.cameraFromWorld.optionalValue.__align =
                     (anon_struct_4_0_00000001_for___align)
                     (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
                local_138.cameraFromWorld.optionalValue.__data[4] = false;
                local_138.cameraFromWorld.optionalValue._5_3_ = 0;
                local_138.cameraFromWorld.optionalValue._8_8_ = 0;
                local_138.cameraFromWorld.optionalValue._16_4_ =
                     (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
                local_138.cameraFromWorld.optionalValue.__data[0x14] = false;
                local_138.cameraFromWorld.optionalValue._21_3_ = 0;
                local_138.cameraFromWorld.optionalValue._24_8_ = 0;
                local_138.cameraFromWorld.optionalValue._32_8_ = 0;
                local_138.cameraFromWorld.optionalValue._40_8_ = 0;
                local_138.cameraFromWorld.optionalValue._48_8_ = 0;
                local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                bVar5 = Image::Write(pIVar2 + uVar16,&local_178,&local_138);
                if (!bVar5) {
                  LogFatal<char_const(&)[38]>
                            (Fatal,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/stats.cpp"
                             ,0x1d1,"Check failed: %s",
                             (char (*) [38])"stats->pixelCounterImages[i].Write(n)");
                }
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::~_Rb_tree(&local_138.stringVectors._M_t);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_178._M_dataplus._M_p != &local_178.field_2) {
                  operator_delete(local_178._M_dataplus._M_p,
                                  local_178.field_2._M_allocated_capacity + 1);
                }
                goto LAB_00484ef1;
              }
              TVar10 = (pIVar18->resolution).super_Tuple2<pbrt::Point2,_int>;
              lVar17 = lVar17 + 1;
            } while (lVar17 < TVar10.x);
          }
          lVar19 = lVar19 + 1;
          lVar15 = lVar15 + 0x100000000;
        } while (lVar19 < (long)TVar10 >> 0x20);
      }
LAB_00484ef1:
      if (local_1f8 != &local_1e8) {
        operator_delete(local_1f8,local_1e8 + 1);
      }
      pSVar8 = local_1b0->stats;
      uVar16 = local_1d8 + 1;
    } while (uVar16 < (ulong)(((long)(pSVar8->pixelCounterImages).
                                     super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)(pSVar8->pixelCounterImages).
                                     super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x79435e50d79435e5));
  }
  if ((pSVar8->pixelRatioImages).super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (pSVar8->pixelRatioImages).super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    oVar11 = (optional<float>)((long)&local_138.cameraFromWorld.optionalValue + 8);
    uVar16 = 0;
    do {
      pSVar4 = local_1b0;
      local_1d0[0] = local_1c0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1d0,pixelStatsBaseName_abi_cxx11_,
                 DAT_02f310a8 + pixelStatsBaseName_abi_cxx11_);
      std::__cxx11::string::append((char *)local_1d0);
      poVar6 = (optional<float> *)
               std::__cxx11::string::_M_append
                         ((char *)local_1d0,
                          (ulong)(pSVar4->stats->pixelRatioNames).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar16]._M_dataplus._M_p)
      ;
      oVar14 = (optional<float>)(poVar6 + 2);
      if (*poVar6 == oVar14) {
        local_138.cameraFromWorld.optionalValue._8_8_ = *(undefined8 *)oVar14;
        local_138.cameraFromWorld.optionalValue._16_8_ = poVar6[3];
        local_138.renderTimeSeconds = oVar11;
      }
      else {
        local_138.cameraFromWorld.optionalValue._8_8_ = *(undefined8 *)oVar14;
        local_138.renderTimeSeconds = *poVar6;
      }
      local_138.cameraFromWorld.optionalValue._0_8_ = poVar6[1];
      *poVar6 = oVar14;
      poVar6[1].optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      poVar6[1].set = false;
      *(undefined3 *)&poVar6[1].field_0x5 = 0;
      poVar6[2].optionalValue.__data[0] = '\0';
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_138);
      local_1f8 = &local_1e8;
      plVar12 = plVar7 + 2;
      if ((long *)*plVar7 == plVar12) {
        local_1e8 = *plVar12;
        lStack_1e0 = plVar7[3];
      }
      else {
        local_1e8 = *plVar12;
        local_1f8 = (long *)*plVar7;
      }
      uVar1 = plVar7[1];
      *plVar7 = (long)plVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if (local_138.renderTimeSeconds != oVar11) {
        operator_delete((void *)local_138.renderTimeSeconds,
                        local_138.cameraFromWorld.optionalValue._8_8_ + 1);
      }
      if (local_1d0[0] != local_1c0) {
        operator_delete(local_1d0[0],local_1c0[0] + 1);
      }
      if (uVar1 != 0) {
        uVar13 = 0;
        do {
          if (*(char *)((long)local_1f8 + uVar13) == '/') {
            *(undefined1 *)((long)local_1f8 + uVar13) = 0x5f;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < uVar1);
      }
      pIVar2 = (pSVar4->stats->pixelRatioImages).
               super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_1a8 = uVar16 * 0x98;
      TVar10 = pIVar2[uVar16].resolution.super_Tuple2<pbrt::Point2,_int>;
      local_1a0 = uVar16;
      if (0 < TVar10.y) {
        pIVar18 = pIVar2 + uVar16;
        lVar15 = 0;
        do {
          if (0 < TVar10.x) {
            lVar19 = 0;
            do {
              Image::GetChannels((ImageChannelValues *)&local_138,pIVar18,
                                 (Point2i)(lVar19 + (lVar15 << 0x20)),(WrapMode2D)0x200000002);
              uVar9 = local_138.cameraFromWorld.optionalValue._0_8_;
              if ((optional<float>)local_138.cameraFromWorld.optionalValue._0_8_ ==
                  (optional<float>)0x0) {
                uVar9 = oVar11;
              }
              auVar21 = ZEXT464(*(uint *)uVar9);
              if (1 < (ulong)local_138.cameraFromWorld.optionalValue._32_8_) {
                uVar16 = 1;
                do {
                  lVar17 = uVar16 * 4;
                  uVar16 = uVar16 + 1;
                  auVar3 = vmaxss_avx(ZEXT416(*(uint *)(uVar9 + lVar17)),auVar21._0_16_);
                  auVar21 = ZEXT1664(auVar3);
                } while (local_138.cameraFromWorld.optionalValue._32_8_ != uVar16);
              }
              local_1d8 = CONCAT44(local_1d8._4_4_,auVar21._0_4_);
              InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                        ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                         &local_138);
              if (((float)local_1d8 != 0.0) || (NAN((float)local_1d8))) {
                pIVar2 = (local_1b0->stats->pixelRatioImages).
                         super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                         super__Vector_impl_data._M_start;
                local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_198,local_1f8,uVar1 + (long)local_1f8);
                local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                     &local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header;
                local_138.colorSpace.optionalValue =
                     (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                      )0x0;
                local_138.colorSpace.set = false;
                local_138.colorSpace._9_7_ = 0;
                local_138.stringVectors._M_t._M_impl._0_8_ = 0;
                local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
                     _S_red;
                local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                     (_Base_ptr)0x0;
                local_138.NDCFromWorld.optionalValue._52_8_ = 0;
                local_138.NDCFromWorld._60_8_ = 0;
                local_138.pixelBounds.optionalValue._0_8_ = 0;
                local_138.pixelBounds.optionalValue._8_8_ = 0;
                local_138._160_8_ = 0;
                local_138.fullResolution._4_8_ = 0;
                local_138.samplesPerPixel.optionalValue =
                     (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
                local_138.samplesPerPixel.set = false;
                local_138.samplesPerPixel._5_3_ = 0;
                local_138.MSE.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
                local_138.MSE.set = false;
                local_138.MSE._5_3_ = 0;
                local_138.cameraFromWorld.optionalValue._56_8_ = 0;
                local_138._72_8_ = 0;
                local_138.NDCFromWorld.optionalValue._4_8_ = 0;
                local_138.NDCFromWorld.optionalValue._12_8_ = 0;
                local_138.NDCFromWorld.optionalValue._20_8_ = 0;
                local_138.NDCFromWorld.optionalValue._28_8_ = 0;
                local_138.NDCFromWorld.optionalValue._36_8_ = 0;
                local_138.NDCFromWorld.optionalValue._44_8_ = 0;
                local_138.renderTimeSeconds.optionalValue =
                     (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
                local_138.renderTimeSeconds.set = false;
                local_138.renderTimeSeconds._5_3_ = 0;
                local_138.cameraFromWorld.optionalValue.__align =
                     (anon_struct_4_0_00000001_for___align)
                     (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
                local_138.cameraFromWorld.optionalValue.__data[4] = false;
                local_138.cameraFromWorld.optionalValue._5_3_ = 0;
                local_138.cameraFromWorld.optionalValue._8_8_ = 0;
                local_138.cameraFromWorld.optionalValue._16_4_ =
                     (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
                local_138.cameraFromWorld.optionalValue.__data[0x14] = false;
                local_138.cameraFromWorld.optionalValue._21_3_ = 0;
                local_138.cameraFromWorld.optionalValue._24_8_ = 0;
                local_138.cameraFromWorld.optionalValue._32_8_ = 0;
                local_138.cameraFromWorld.optionalValue._40_8_ = 0;
                local_138.cameraFromWorld.optionalValue._48_8_ = 0;
                local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
                local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                     local_138.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                bVar5 = Image::Write((Image *)((long)&pIVar2->format + local_1a8),&local_198,
                                     &local_138);
                if (!bVar5) {
                  LogFatal<char_const(&)[36]>
                            (Fatal,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/stats.cpp"
                             ,0x1e2,"Check failed: %s",
                             (char (*) [36])"stats->pixelRatioImages[i].Write(n)");
                }
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::~_Rb_tree(&local_138.stringVectors._M_t);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_198._M_dataplus._M_p != &local_198.field_2) {
                  operator_delete(local_198._M_dataplus._M_p,
                                  local_198.field_2._M_allocated_capacity + 1);
                }
                goto LAB_0048527e;
              }
              TVar10 = (pIVar18->resolution).super_Tuple2<pbrt::Point2,_int>;
              lVar19 = lVar19 + 1;
            } while (lVar19 < TVar10.x);
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < (long)TVar10 >> 0x20);
      }
LAB_0048527e:
      if (local_1f8 != &local_1e8) {
        operator_delete(local_1f8,local_1e8 + 1);
      }
      uVar16 = local_1a0 + 1;
    } while (uVar16 < (ulong)(((long)(local_1b0->stats->pixelRatioImages).
                                     super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_1b0->stats->pixelRatioImages).
                                     super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x79435e50d79435e5));
  }
  return;
}

Assistant:

void StatsAccumulator::WritePixelImages() const {
    // FIXME: do this where?
    CHECK(stats->pixelTime.Write(pixelStatsBaseName + "-time.exr"));

    for (size_t i = 0; i < stats->pixelCounterImages.size(); ++i) {
        std::string n = pixelStatsBaseName + "-" + stats->pixelCounterNames[i] + ".exr";
        for (size_t j = 0; j < n.size(); ++j)
            if (n[j] == '/')
                n[j] = '_';

        auto AllZero = [](const Image &im) {
            for (int y = 0; y < im.Resolution().y; ++y)
                for (int x = 0; x < im.Resolution().x; ++x)
                    if (im.GetChannel({x, y}, 0) != 0)
                        return false;
            return true;
        };
        if (!AllZero(stats->pixelCounterImages[i]))
            CHECK(stats->pixelCounterImages[i].Write(n));
    }

    for (size_t i = 0; i < stats->pixelRatioImages.size(); ++i) {
        std::string n = pixelStatsBaseName + "-" + stats->pixelRatioNames[i] + ".exr";
        for (size_t j = 0; j < n.size(); ++j)
            if (n[j] == '/')
                n[j] = '_';

        auto AllZero = [](const Image &im) {
            for (int y = 0; y < im.Resolution().y; ++y)
                for (int x = 0; x < im.Resolution().x; ++x)
                    if (im.GetChannels({x, y}).MaxValue() != 0)
                        return false;
            return true;
        };
        if (!AllZero(stats->pixelRatioImages[i]))
            CHECK(stats->pixelRatioImages[i].Write(n));
    }
}